

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
tinyusdz::tydra::GetGeomSubsetChildren
          (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
           *__return_storage_ptr__,Prim *prim,token *familyName,bool prim_must_be_geommesh)

{
  pointer *pppGVar1;
  byte bVar2;
  vtable_type *pvVar3;
  pointer pPVar4;
  long lVar5;
  size_t __n;
  uint32_t uVar6;
  int iVar7;
  undefined7 in_register_00000009;
  pointer pPVar8;
  iterator __position;
  GeomSubset *pv;
  GeomSubset *local_60;
  byte local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((int)CONCAT71(in_register_00000009,prim_must_be_geommesh) == 0) ||
     ((pvVar3 = (prim->_data).v_.vtable, pvVar3 != (vtable_type *)0x0 &&
      (uVar6 = (*pvVar3->type_id)(), uVar6 == 0x405)))) {
    pPVar8 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar4 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar8 != pPVar4) {
      do {
        local_60 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(&pPVar8->_data,false);
        if (local_60 != (GeomSubset *)0x0) {
          if ((familyName->str_)._M_string_length == 0) {
LAB_003410fa:
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0034110e:
              ::std::vector<tinyusdz::GeomSubset_const*,std::allocator<tinyusdz::GeomSubset_const*>>
              ::_M_realloc_insert<tinyusdz::GeomSubset_const*const&>
                        ((vector<tinyusdz::GeomSubset_const*,std::allocator<tinyusdz::GeomSubset_const*>>
                          *)__return_storage_ptr__,__position,&local_60);
            }
            else {
LAB_00341104:
              *__position._M_current = local_60;
              pppGVar1 = &(__return_storage_ptr__->
                          super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppGVar1 = *pppGVar1 + 1;
            }
          }
          else {
            bVar2 = (local_60->familyName)._attrib.has_value_;
            if ((bool)bVar2 == false) {
              if ((((local_60->familyName)._paths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    (local_60->familyName)._paths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_start) &&
                  ((local_60->familyName)._value_empty == false)) &&
                 ((local_60->familyName)._blocked != true)) goto LAB_003410fa;
            }
            else {
              lVar5 = *(long *)&(local_60->familyName)._attrib.contained;
              local_58 = bVar2;
              local_50 = local_40;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,lVar5,
                         *(long *)((long)&(local_60->familyName)._attrib.contained + 8) + lVar5);
              bVar2 = local_58;
            }
            local_58 = bVar2;
            if ((local_58 & 1) != 0) {
              if (local_50 != local_40) {
                operator_delete(local_50,local_40[0] + 1);
              }
              local_58 = (local_60->familyName)._attrib.has_value_;
              if ((bool)local_58 == true) {
                lVar5 = *(long *)&(local_60->familyName)._attrib.contained;
                local_50 = local_40;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,lVar5,
                           *(long *)((long)&(local_60->familyName)._attrib.contained + 8) + lVar5);
              }
              if ((local_58 & 1) == 0) {
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x584,
                              "const value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() const [T = tinyusdz::Token]"
                             );
              }
              if (local_50 != local_40) {
                operator_delete(local_50,local_40[0] + 1);
              }
              __n = (familyName->str_)._M_string_length;
              if ((__n == local_48) &&
                 ((__n == 0 ||
                  (iVar7 = bcmp((familyName->str_)._M_dataplus._M_p,local_50,__n), iVar7 == 0)))) {
                __position._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0034110e;
                goto LAB_00341104;
              }
            }
          }
        }
        pPVar8 = pPVar8 + 1;
      } while (pPVar8 != pPVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const GeomSubset *> GetGeomSubsetChildren(
    const tinyusdz::Prim &prim, const tinyusdz::value::token &familyName,
    bool prim_must_be_geommesh) {
  std::vector<const GeomSubset *> result;

  if (prim_must_be_geommesh && !prim.is<GeomMesh>()) {
    return result;
  }

  // Only account for child Prims.
  for (const auto &p : prim.children()) {
    if (auto pv = p.as<GeomSubset>()) {
      if (familyName.valid()) {
        if (pv->familyName.authored()) {
          if (pv->familyName.get_value().has_value()) {
            const value::token &tok = pv->familyName.get_value().value();
            if (familyName.str() == tok.str()) {
              result.push_back(pv);
            }
          } else {
            // connection attr or value block?
            // skip adding this GeomSubset.
          }
        } else {
          result.push_back(pv);
        }
      } else {
        result.push_back(pv);
      }
    }
  }

  return result;
}